

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddLin.c
# Opt level: O0

Move * cuddZddLinearDown(DdManager *table,int x,int xHigh,Move *prevMoves)

{
  Move *pMVar1;
  int iVar2;
  uint uVar3;
  DdNode *pDVar4;
  uint local_48;
  int limitSize;
  int newsize;
  int size;
  int y;
  Move *move;
  Move *moves;
  Move *prevMoves_local;
  int xHigh_local;
  int x_local;
  DdManager *table_local;
  
  local_48 = table->keysZ;
  newsize = cuddZddNextHigh(table,x);
  move = prevMoves;
  prevMoves_local._4_4_ = x;
  while( true ) {
    if (xHigh < newsize) {
      return move;
    }
    limitSize = cuddZddSwapInPlace(table,prevMoves_local._4_4_,newsize);
    if (((limitSize == 0) ||
        (iVar2 = cuddZddLinearInPlace(table,prevMoves_local._4_4_,newsize), iVar2 == 0)) ||
       (pDVar4 = cuddDynamicAllocNode(table), pDVar4 == (DdNode *)0x0)) break;
    pDVar4->index = prevMoves_local._4_4_;
    pDVar4->ref = newsize;
    (pDVar4->type).kids.T = (DdNode *)move;
    *(undefined4 *)&pDVar4->next = 0;
    move = (Move *)pDVar4;
    if (limitSize < iVar2) {
      uVar3 = cuddZddLinearInPlace(table,prevMoves_local._4_4_,newsize);
      if (uVar3 == 0) break;
      if (uVar3 != limitSize) {
        fprintf((FILE *)table->err,"Change in size after identity transformation! From %d to %d\n",
                (ulong)(uint)limitSize,(ulong)uVar3);
      }
    }
    else {
      *(undefined4 *)&pDVar4->next = 1;
      limitSize = iVar2;
    }
    *(int *)((long)&pDVar4->next + 4) = limitSize;
    if ((double)(int)local_48 * table->maxGrowth < (double)limitSize) {
      return (Move *)pDVar4;
    }
    if (limitSize < (int)local_48) {
      local_48 = limitSize;
    }
    prevMoves_local._4_4_ = newsize;
    newsize = cuddZddNextHigh(table,newsize);
  }
  while (move != (Move *)0x0) {
    pMVar1 = move->next;
    move->y = 0;
    *(DdNode **)&move->flags = table->nextFree;
    table->nextFree = (DdNode *)move;
    move = pMVar1;
  }
  return (Move *)0xffffffffffffffff;
}

Assistant:

static Move *
cuddZddLinearDown(
  DdManager * table,
  int  x,
  int  xHigh,
  Move * prevMoves)
{
    Move        *moves;
    Move        *move;
    int         y;
    int         size, newsize;
    int         limitSize;

    moves = prevMoves;
    limitSize = table->keysZ;

    y = cuddZddNextHigh(table, x);
    while (y <= xHigh) {
        size = cuddZddSwapInPlace(table, x, y);
        if (size == 0)
            goto cuddZddLinearDownOutOfMem;
        newsize = cuddZddLinearInPlace(table, x, y);
        if (newsize == 0)
            goto cuddZddLinearDownOutOfMem;
        move = (Move *) cuddDynamicAllocNode(table);
        if (move == NULL)
            goto cuddZddLinearDownOutOfMem;
        move->x = x;
        move->y = y;
        move->next = moves;
        moves = move;
        move->flags = CUDD_SWAP_MOVE;
        if (newsize > size) {
            /* Undo transformation. The transformation we apply is
            ** its own inverse. Hence, we just apply the transformation
            ** again.
            */
            newsize = cuddZddLinearInPlace(table,x,y);
            if (newsize == 0) goto cuddZddLinearDownOutOfMem;
            if (newsize != size) {
                (void) fprintf(table->err,"Change in size after identity transformation! From %d to %d\n",size,newsize);
            }
        } else {
            size = newsize;
            move->flags = CUDD_LINEAR_TRANSFORM_MOVE;
        }
        move->size = size;

        if ((double)size > (double)limitSize * table->maxGrowth)
            break;
        if (size < limitSize)
            limitSize = size;

        x = y;
        y = cuddZddNextHigh(table, x);
    }
    return(moves);

cuddZddLinearDownOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return((Move *) CUDD_OUT_OF_MEM);

}